

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void * rollback_during_ops_test(void *args)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  fdb_config *fconfig;
  char *pcVar5;
  fdb_kvs_handle **ppfVar6;
  uint uVar7;
  uint uVar8;
  fdb_kvs_handle *unaff_RBP;
  ulong uVar9;
  char *pcVar10;
  fdb_kvs_handle **ppfVar11;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  fdb_config *fconfig_00;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *pfVar12;
  fdb_config *unaff_R15;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  pthread_t tid;
  char str [15];
  void *thread_ret;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config config;
  fdb_kvs_handle *pfStack_3140;
  fdb_kvs_handle *pfStack_3138;
  fdb_file_handle *pfStack_3130;
  fdb_iterator *pfStack_3128;
  fdb_doc *pfStack_3120;
  fdb_kvs_handle *pfStack_3118;
  timeval tStack_3110;
  fdb_kvs_config fStack_3100;
  fdb_config fStack_30e8;
  fdb_config *pfStack_2ff0;
  fdb_kvs_handle *pfStack_2fe8;
  fdb_kvs_handle *pfStack_2fe0;
  fdb_file_handle *pfStack_2fd8;
  fdb_kvs_handle *pfStack_2fd0;
  char acStack_2fc7 [15];
  filemgr *pfStack_2fb8;
  docio_handle *pdStack_2fb0;
  btreeblk_handle *pbStack_2fa8;
  size_t sStack_2fa0;
  filemgr *pfStack_2f98;
  docio_handle *pdStack_2f90;
  btreeblk_handle *pbStack_2f88;
  timeval tStack_2f80;
  undefined1 auStack_2f70 [76];
  uint uStack_2f24;
  char *pcStack_2e30;
  atomic<unsigned_long> aStack_2e28;
  btree *pbStack_2e20;
  fdb_kvs_handle *pfStack_2e18;
  fdb_kvs_handle *pfStack_2e10;
  code *pcStack_2e08;
  uint uStack_2df4;
  fdb_txn *pfStack_2df0;
  fdb_kvs_handle *pfStack_2de8;
  fdb_iterator *pfStack_2de0;
  fdb_snapshot_info_t *pfStack_2dd8;
  int iStack_2dcc;
  fdb_kvs_handle *pfStack_2dc8;
  fdb_kvs_handle *apfStack_2dc0 [3];
  uint64_t uStack_2da8;
  fdb_kvs_config fStack_2da0;
  char acStack_2d88 [8];
  timeval tStack_2d80;
  char acStack_2d70 [256];
  btree bStack_2c70;
  char acStack_2c20 [256];
  char acStack_2b20 [256];
  fdb_config fStack_2a20;
  fdb_kvs_handle **ppfStack_2928;
  fdb_kvs_handle **ppfStack_2920;
  fdb_kvs_handle *pfStack_2918;
  fdb_kvs_handle **ppfStack_2910;
  fdb_kvs_handle *pfStack_2908;
  code *pcStack_2900;
  fdb_kvs_handle **ppfStack_28f8;
  fdb_kvs_handle *pfStack_28f0;
  fdb_kvs_handle *apfStack_28e8 [9];
  fdb_kvs_config fStack_28a0;
  timeval tStack_2888;
  fdb_kvs_handle *apfStack_2878 [33];
  fdb_config fStack_2770;
  fdb_kvs_handle *apfStack_2678 [32];
  fdb_kvs_handle *apfStack_2578 [32];
  fdb_kvs_handle afStack_2478 [15];
  fdb_config *pfStack_470;
  fdb_kvs_handle *pfStack_468;
  fdb_kvs_handle *pfStack_460;
  fdb_config *pfStack_458;
  fdb_config *pfStack_450;
  fdb_kvs_handle *pfStack_448;
  fdb_kvs_handle *pfStack_438;
  fdb_file_handle *pfStack_430;
  fdb_iterator *pfStack_428;
  fdb_doc *pfStack_420;
  fdb_kvs_handle *pfStack_418;
  undefined1 auStack_40f [31];
  undefined1 auStack_3f0 [72];
  fdb_config fStack_3a8;
  int *piStack_2b0;
  fdb_kvs_handle *pfStack_2a8;
  fdb_kvs_handle *pfStack_2a0;
  fdb_config *pfStack_298;
  fdb_config *pfStack_290;
  fdb_kvs_handle *local_280;
  fdb_file_handle *local_278;
  undefined4 local_26c;
  pthread_t local_268;
  undefined1 local_25f [31];
  fdb_config *pfStack_240;
  uint64_t local_238;
  timeval local_230;
  fdb_config local_220;
  fdb_config local_128;
  
  pfStack_290 = (fdb_config *)0x11bc37;
  gettimeofday(&local_230,(__timezone_ptr_t)0x0);
  pfStack_290 = (fdb_config *)0x11bc3c;
  memleak_start();
  local_26c = 10000;
  if (args != (void *)0x0) goto LAB_0011bfb5;
  pfStack_290 = (fdb_config *)0x11bc59;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_290 = (fdb_config *)0x11bc66;
  fdb_get_default_config();
  fconfig_00 = &local_128;
  pfStack_290 = (fdb_config *)0x11bc7e;
  memcpy(fconfig_00,&local_220,0xf8);
  local_128.block_reusing_threshold = 0;
  pfStack_290 = (fdb_config *)0x11bc9d;
  fVar2 = fdb_open(&local_278,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_290 = (fdb_config *)0x11bcb2;
    fdb_get_default_kvs_config();
    local_238 = local_220.wal_threshold;
    local_25f._23_2_ = local_220.chunksize;
    local_25f._25_2_ = local_220._2_2_;
    local_25f._27_4_ = local_220.blocksize;
    pfStack_240 = (fdb_config *)local_220.buffercache_size;
    pfStack_290 = (fdb_config *)0x11bcd4;
    fVar2 = fdb_kvs_open_default(local_278,&local_280,(fdb_kvs_config *)(local_25f + 0x17));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    unaff_R13 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    args = (int *)0x1;
    uVar8 = 0;
    do {
      uVar7 = uVar8 + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar7;
      pfStack_290 = (fdb_config *)0x11bd03;
      sprintf(local_25f,"%d",unaff_RBP);
      unaff_R12 = local_280;
      pfStack_290 = (fdb_config *)0x11bd10;
      sVar4 = strlen(local_25f);
      pfStack_290 = (fdb_config *)0x11bd2b;
      fVar2 = fdb_set_kv(unaff_R12,local_25f,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_290 = (fdb_config *)0x11bfab;
        rollback_during_ops_test();
        goto LAB_0011bfab;
      }
      if ((int)((ulong)args / 10) * 10 - 1U == uVar8) {
        unaff_R13 = (fdb_kvs_handle *)((ulong)unaff_R13 ^ 1);
        pfStack_290 = (fdb_config *)0x11bd66;
        fdb_commit(local_278,(fdb_commit_opt_t)unaff_R13);
      }
      args = (void *)(ulong)((int)args + 1);
      uVar8 = uVar7;
    } while (uVar7 < 10000);
    unaff_RBP = (fdb_kvs_handle *)0x1;
    pfStack_290 = (fdb_config *)0x11bd8b;
    fdb_commit(local_278,'\x01');
    pfStack_290 = (fdb_config *)0x11bd9a;
    fdb_get_kvs_info(local_280,(fdb_kvs_info *)&local_220);
    args = (void *)((long)&local_220 + 8);
    if ((fdb_config *)local_220.buffercache_size != (fdb_config *)0x2710) {
      pfStack_290 = (fdb_config *)0x11bdb0;
      rollback_during_ops_test();
    }
    pfStack_290 = (fdb_config *)0x11bdc8;
    pthread_create(&local_268,(pthread_attr_t *)0x0,rollback_during_ops_test,&local_26c);
    fconfig_00 = (fdb_config *)0x155958;
    unaff_R15 = (fdb_config *)local_25f;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_290 = (fdb_config *)0x11bdea;
      sprintf((char *)unaff_R15,"%d",unaff_RBP);
      unaff_R13 = local_280;
      pfStack_290 = (fdb_config *)0x11bdf7;
      sVar4 = strlen((char *)unaff_R15);
      pfStack_290 = (fdb_config *)0x11be0e;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
        pfStack_290 = (fdb_config *)0x11be2a;
        fVar2 = fdb_commit(local_278,'\x01');
        if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
        goto LAB_0011bfb0;
      }
      uVar8 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar8;
    } while (uVar8 != 0x2711);
    pfStack_290 = (fdb_config *)0x11be50;
    pthread_join(local_268,(void **)(local_25f + 0xf));
    pfStack_290 = (fdb_config *)0x11be73;
    fVar2 = fdb_set_kv(local_280,"key1",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
    pfStack_290 = (fdb_config *)0x11be8a;
    fVar2 = fdb_commit(local_278,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
    pfStack_290 = (fdb_config *)0x11bea4;
    fdb_get_kvs_info(local_280,(fdb_kvs_info *)&local_220);
    fconfig_00 = (fdb_config *)local_220.buffercache_size;
    pfStack_290 = (fdb_config *)0x11becb;
    fVar2 = fdb_set_kv(local_280,"key2",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
    pfStack_290 = (fdb_config *)0x11bef6;
    fVar2 = fdb_set_kv(local_280,"key3",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
    pfStack_290 = (fdb_config *)0x11bf0d;
    fVar2 = fdb_commit(local_278,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
    pfStack_290 = (fdb_config *)0x11bf22;
    fVar2 = fdb_rollback(&local_280,(fdb_seqnum_t)fconfig_00);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_290 = (fdb_config *)0x11bf3c;
      fdb_get_kvs_info(local_280,(fdb_kvs_info *)&local_220);
      if ((fdb_config *)local_220.buffercache_size != fconfig_00) {
        pfStack_290 = (fdb_config *)0x11bf4d;
        rollback_during_ops_test();
      }
      pfStack_290 = (fdb_config *)0x11bf57;
      fdb_close(local_278);
      pfStack_290 = (fdb_config *)0x11bf5c;
      fdb_shutdown();
      pfStack_290 = (fdb_config *)0x11bf61;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (rollback_during_ops_test(void*)::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_290 = (fdb_config *)0x11bf92;
      fprintf(_stderr,pcVar10,"rollback during ops test");
      return (void *)0x0;
    }
  }
  else {
    pfStack_290 = (fdb_config *)0x11c0df;
    rollback_during_ops_test();
LAB_0011c0df:
    args = &local_220;
    pfStack_290 = (fdb_config *)0x11c0e4;
    rollback_during_ops_test();
LAB_0011c0e4:
    pfStack_290 = (fdb_config *)0x11c0e9;
    rollback_during_ops_test();
LAB_0011c0e9:
    pfStack_290 = (fdb_config *)0x11c0ee;
    rollback_during_ops_test();
LAB_0011c0ee:
    pfStack_290 = (fdb_config *)0x11c0f3;
    rollback_during_ops_test();
LAB_0011c0f3:
    pfStack_290 = (fdb_config *)0x11c0f8;
    rollback_during_ops_test();
LAB_0011c0f8:
    pfStack_290 = (fdb_config *)0x11c0fd;
    rollback_during_ops_test();
  }
  pfStack_290 = (fdb_config *)0x11c102;
  rollback_during_ops_test();
LAB_0011c102:
  pfStack_290 = (fdb_config *)0x11c107;
  rollback_during_ops_test();
  goto LAB_0011c107;
LAB_0011c3a8:
  pfStack_448 = (fdb_kvs_handle *)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_2900 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_2900 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_2900 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_2900 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_2900 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_2900 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_2900 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_2e08 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_2fe0 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_2fe0 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011bfab:
  pfStack_290 = (fdb_config *)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  pfStack_290 = (fdb_config *)0x11bfb5;
  rollback_during_ops_test();
LAB_0011bfb5:
  fconfig_00 = &local_220;
  pfStack_290 = (fdb_config *)0x11bfc2;
  fdb_get_default_config();
  unaff_R15 = &local_128;
  pfStack_290 = (fdb_config *)0x11bfda;
  memcpy(unaff_R15,fconfig_00,0xf8);
  local_128.block_reusing_threshold = 0;
  pfStack_290 = (fdb_config *)0x11bff9;
  fVar2 = fdb_open(&local_278,"mvcc_test1",unaff_R15);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
  fconfig_00 = &local_220;
  pfStack_290 = (fdb_config *)0x11c00e;
  fdb_get_default_kvs_config();
  local_238 = local_220.wal_threshold;
  local_25f._23_2_ = local_220.chunksize;
  local_25f._25_2_ = local_220._2_2_;
  local_25f._27_4_ = local_220.blocksize;
  pfStack_240 = (fdb_config *)local_220.buffercache_size;
  pfStack_290 = (fdb_config *)0x11c031;
  fVar2 = fdb_kvs_open_default(local_278,&local_280,(fdb_kvs_config *)(local_25f + 0x17));
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if (1 < (long)*args) {
      unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
      fconfig_00 = (fdb_config *)0x155958;
      unaff_R15 = (fdb_config *)local_25f;
      unaff_R12 = (fdb_kvs_handle *)0x1555bd;
      args = (int *)(long)*args;
      do {
        pfStack_290 = (fdb_config *)0x11c06e;
        sprintf((char *)unaff_R15,"%d",(ulong)args & 0xffffffff);
        unaff_RBP = local_280;
        pfStack_290 = (fdb_config *)0x11c07b;
        sVar4 = strlen((char *)unaff_R15);
        pfStack_290 = (fdb_config *)0x11c092;
        fVar2 = fdb_set_kv(unaff_RBP,unaff_R15,sVar4,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
        if ((int)(((ulong)args & 0xffffffff) / 10) * -10 + (int)args == 0) {
          pfStack_290 = (fdb_config *)0x11c0b8;
          fVar2 = fdb_rollback(&local_280,(fdb_seqnum_t)args);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
        }
        bVar1 = 2 < (long)args;
        args = (void *)((long)args + -1);
      } while (bVar1);
    }
    pfStack_290 = (fdb_config *)0x11c0d3;
    fdb_close(local_278);
    pfStack_290 = (fdb_config *)0x11c0da;
    pthread_exit((void *)0x0);
  }
LAB_0011c107:
  pfStack_290 = (fdb_config *)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  pfStack_290 = (fdb_config *)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  pfStack_290 = (fdb_config *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_448 = (fdb_kvs_handle *)0x11c132;
  piStack_2b0 = (int *)args;
  pfStack_2a8 = unaff_R12;
  pfStack_2a0 = unaff_R13;
  pfStack_298 = fconfig_00;
  pfStack_290 = unaff_R15;
  gettimeofday((timeval *)(auStack_40f + 0xf),(__timezone_ptr_t)0x0);
  pfStack_448 = (fdb_kvs_handle *)0x11c137;
  memleak_start();
  pfStack_448 = (fdb_kvs_handle *)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_3a8;
  pfStack_448 = (fdb_kvs_handle *)0x11c153;
  fdb_get_default_config();
  pfStack_448 = (fdb_kvs_handle *)0x11c167;
  fVar2 = fdb_open(&pfStack_430,"mvcc_test1",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig = (fdb_config *)(auStack_3f0 + 0x30);
    pfStack_448 = (fdb_kvs_handle *)0x11c17f;
    fdb_get_default_kvs_config();
    pfStack_448 = (fdb_kvs_handle *)0x11c191;
    fVar2 = fdb_kvs_open_default(pfStack_430,&pfStack_438,(fdb_kvs_config *)fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig = (fdb_config *)0x1;
    fconfig_00 = (fdb_config *)0x155958;
    unaff_R15 = (fdb_config *)auStack_40f;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_448 = (fdb_kvs_handle *)0x11c1c0;
      sprintf((char *)unaff_R15,"%d",fconfig);
      unaff_R13 = pfStack_438;
      pfStack_448 = (fdb_kvs_handle *)0x11c1cd;
      sVar4 = strlen((char *)unaff_R15);
      pfStack_448 = (fdb_kvs_handle *)0x11c1e4;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_448 = (fdb_kvs_handle *)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar8 = (int)fconfig + 1;
      fconfig = (fdb_config *)(ulong)uVar8;
    } while (uVar8 != 4);
    pfStack_448 = (fdb_kvs_handle *)0x11c1ff;
    fdb_commit(pfStack_430,'\0');
    pfStack_448 = (fdb_kvs_handle *)0x11c222;
    fVar2 = fdb_set_kv(pfStack_438,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    pfStack_448 = (fdb_kvs_handle *)0x11c24d;
    fVar2 = fdb_set_kv(pfStack_438,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    pfStack_448 = (fdb_kvs_handle *)0x11c264;
    fVar2 = fdb_commit(pfStack_430,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    pfStack_448 = (fdb_kvs_handle *)0x11c27b;
    fVar2 = fdb_rollback(&pfStack_438,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig = (fdb_config *)auStack_3f0;
    pfStack_448 = (fdb_kvs_handle *)0x11c295;
    fdb_get_kvs_info(pfStack_438,(fdb_kvs_info *)fconfig);
    if (auStack_3f0._8_8_ != 3) {
      pfStack_448 = (fdb_kvs_handle *)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    pfStack_448 = (fdb_kvs_handle *)0x11c2bc;
    fVar2 = fdb_snapshot_open(pfStack_438,&pfStack_418,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    pfStack_448 = (fdb_kvs_handle *)0x11c2e4;
    fdb_iterator_init(pfStack_418,&pfStack_428,(void *)0x0,0,(void *)0x0,0,0);
    fconfig = (fdb_config *)&pfStack_420;
    pfStack_420 = (fdb_doc *)0x0;
    fconfig_00 = (fdb_config *)0x3;
    do {
      pfStack_448 = (fdb_kvs_handle *)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_428,(fdb_doc **)fconfig);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      pfStack_448 = (fdb_kvs_handle *)0x11c315;
      fdb_doc_free(pfStack_420);
      pfStack_420 = (fdb_doc *)0x0;
      pfStack_448 = (fdb_kvs_handle *)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_428);
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_00 == (fdb_config *)0x0) {
      pfStack_448 = (fdb_kvs_handle *)0x11c343;
      fdb_iterator_close(pfStack_428);
      pfStack_448 = (fdb_kvs_handle *)0x11c34d;
      fdb_kvs_close(pfStack_418);
      pfStack_448 = (fdb_kvs_handle *)0x11c357;
      fdb_close(pfStack_430);
      pfStack_448 = (fdb_kvs_handle *)0x11c35c;
      fdb_shutdown();
      pfStack_448 = (fdb_kvs_handle *)0x11c361;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pfStack_448 = (fdb_kvs_handle *)0x11c392;
      iVar3 = fprintf(_stderr,pcVar10,"in-memory snapshot rollback test");
      return (void *)CONCAT44(extraout_var,iVar3);
    }
  }
  else {
LAB_0011c3ad:
    pfStack_448 = (fdb_kvs_handle *)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    pfStack_448 = (fdb_kvs_handle *)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    pfStack_448 = (fdb_kvs_handle *)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    pfStack_448 = (fdb_kvs_handle *)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    pfStack_448 = (fdb_kvs_handle *)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    pfStack_448 = (fdb_kvs_handle *)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    pfStack_448 = (fdb_kvs_handle *)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  pfStack_448 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_2900 = (code *)0x11c3f2;
  pfStack_470 = fconfig;
  pfStack_468 = unaff_R12;
  pfStack_460 = unaff_R13;
  pfStack_458 = fconfig_00;
  pfStack_450 = unaff_R15;
  pfStack_448 = unaff_RBP;
  gettimeofday(&tStack_2888,(__timezone_ptr_t)0x0);
  pcStack_2900 = (code *)0x11c3f7;
  memleak_start();
  pcStack_2900 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2900 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_2900 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_2770.wal_threshold = 0x400;
  fStack_2770.compaction_mode = 0;
  fStack_2770.durability_opt = 2;
  pfVar12 = (fdb_kvs_handle *)(apfStack_2578 + 0x20);
  ppfVar6 = apfStack_2878;
  pcVar10 = "kvs%d";
  uVar9 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_2900 = (code *)0x11c45d;
    sprintf((char *)ppfVar6,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar5 = (char *)(apfStack_28e8 + (long)__s);
    pcStack_2900 = (code *)0x11c478;
    ppfVar11 = (fdb_kvs_handle **)pcVar5;
    fVar2 = fdb_open((fdb_file_handle **)pcVar5,(char *)ppfVar6,(fdb_config *)(apfStack_2878 + 0x21)
                    );
    iVar3 = (int)ppfVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar11 = (fdb_kvs_handle **)0x0;
    ppfStack_28f8 = __s;
    pfStack_28f0 = pfVar12;
    do {
      __s = ppfVar11;
      pcStack_2900 = (code *)0x11c49d;
      sprintf((char *)ppfVar6,"kvs%d",(ulong)(uint)((int)__s + (int)uVar9));
      pfVar13 = *(fdb_kvs_handle **)pcVar5;
      pcStack_2900 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar13,(fdb_kvs_handle **)pfVar12,(char *)ppfVar6,
                           (fdb_kvs_config *)(apfStack_28e8 + 9));
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_2900 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).custom_cmp;
      ppfVar11 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_28f8 + 1);
    uVar9 = uVar9 + 0x80;
    pfVar12 = (fdb_kvs_handle *)&pfStack_28f0[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_2878 + 0x40;
  ppfVar6 = apfStack_2578;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    uVar9 = 0;
    do {
      pcStack_2900 = (code *)0x11c511;
      sprintf((char *)__s,"key%08d",uVar9);
      pcStack_2900 = (code *)0x11c524;
      sprintf((char *)ppfVar6,"value%08d",uVar9);
      pcVar10 = (char *)apfStack_2578[(long)&pfVar12->op_stats];
      pcStack_2900 = (code *)0x11c534;
      sVar4 = strlen((char *)__s);
      pcVar5 = (char *)(sVar4 + 1);
      pcStack_2900 = (code *)0x11c540;
      sVar4 = strlen((char *)ppfVar6);
      pcStack_2900 = (code *)0x11c555;
      pfVar13 = (fdb_kvs_handle *)pcVar10;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar10,__s,(size_t)pcVar5,ppfVar6,sVar4 + 1);
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar13 = apfStack_28e8[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2900 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\0');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_2900 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\x01');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  pcVar5 = "key%08d";
  __s = apfStack_2878 + 0x40;
  ppfVar6 = (fdb_kvs_handle **)0x0;
  do {
    uVar9 = 0;
    do {
      pcStack_2900 = (code *)0x11c5ca;
      sprintf((char *)__s,"key%08d",uVar9);
      pfVar12 = apfStack_2578[(long)(ppfVar6 + 4)];
      pcStack_2900 = (code *)0x11c5da;
      sVar4 = strlen((char *)__s);
      pcStack_2900 = (code *)0x11c5e9;
      pfVar13 = pfVar12;
      fVar2 = fdb_del_kv(pfVar12,__s,sVar4 + 1);
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 10);
    ppfVar6 = (fdb_kvs_handle **)((long)ppfVar6 + 1);
  } while (ppfVar6 != (fdb_kvs_handle **)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar13 = apfStack_28e8[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2900 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\0');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_2900 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\x01');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar5 = (char *)(apfStack_2578 + 0x20);
  do {
    pcStack_2900 = (code *)0x11c657;
    ppfVar11 = (fdb_kvs_handle **)pcVar5;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar5,10);
    iVar3 = (int)ppfVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    __s = __s + 8;
    pcVar5 = (char *)((long)pcVar5 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar6 = apfStack_28e8;
  pcVar5 = "kvs%d";
  __s = apfStack_2878;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pfVar13 = apfStack_2578[(long)&pfVar12->op_stats];
    pcStack_2900 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar13);
    iVar3 = (int)pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_2900 = (code *)0x11c6af;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar12 & 0xffffffff);
    pfVar13 = *ppfVar6;
    pcStack_2900 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar13,(char *)__s);
    iVar3 = (int)pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->config).wal_threshold;
    ppfVar6 = ppfVar6 + 1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar13 = apfStack_28e8[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2900 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\0');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_2900 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar13,'\x01');
      iVar3 = (int)pfVar13;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  pcVar5 = "mvcc_test_compact%d";
  __s = apfStack_2878;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_2900 = (code *)0x11c72d;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar12 & 0xffffffff);
    pfVar13 = apfStack_28e8[(long)pfVar12];
    pcStack_2900 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar13,(char *)__s);
    iVar3 = (int)pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x8);
  pcVar5 = (char *)0x0;
  pcStack_2900 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar13 = apfStack_28e8[(long)pcVar5];
    pcStack_2900 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar13);
    iVar3 = (int)pfVar13;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar5 = (char *)((long)pcVar5 + 1);
    if (pcVar5 == (char *)0x8) {
      pcStack_2900 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_2900 = (code *)0x11c775;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pcStack_2900 = (code *)0x11c7a6;
      iVar3 = fprintf(_stderr,pcVar10,"open multi files kvs test");
      return (void *)CONCAT44(extraout_var_00,iVar3);
    }
  }
LAB_0011c7e0:
  pcStack_2900 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_2900 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_2900 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_2900 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_2900 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_2900 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_2900 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_2e08 = (code *)0x11c825;
  ppfStack_2928 = (fdb_kvs_handle **)pcVar5;
  ppfStack_2920 = ppfVar6;
  pfStack_2918 = (fdb_kvs_handle *)pcVar10;
  ppfStack_2910 = __s;
  pfStack_2908 = pfVar12;
  pcStack_2900 = (code *)uVar9;
  gettimeofday(&tStack_2d80,(__timezone_ptr_t)0x0);
  pcStack_2e08 = (code *)0x11c82a;
  memleak_start();
  pcStack_2e08 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_2e08 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_2a20.flags = 1;
  fStack_2a20.block_reusing_threshold = 0;
  fStack_2a20.seqtree_opt = 0;
  pcStack_2e08 = (code *)0x11c86a;
  fStack_2a20.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2e08 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_2df0,"./mvcc_test1",(fdb_config *)(acStack_2b20 + 0x100));
  iStack_2dcc = iVar3;
  if (iVar3 == 0) {
    pcStack_2e08 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_2df0,apfStack_2dc0,&fStack_2da0);
    pcVar10 = (char *)0x1;
  }
  else {
    ppfVar6 = apfStack_2dc0;
    uVar9 = 0;
    do {
      pcStack_2e08 = (code *)0x11c8af;
      sprintf(acStack_2d88,"kv%d",uVar9 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_2df0,ppfVar6,acStack_2d88,&fStack_2da0);
      uVar9 = uVar9 + 1;
      ppfVar6 = ppfVar6 + 1;
    } while (uVar9 != 3);
    pcVar10 = (char *)0x3;
  }
  uStack_2df4 = 0;
  do {
    uVar9 = 0;
    do {
      pcStack_2e08 = (code *)0x11c916;
      sprintf(acStack_2c20,"key%d",uVar9 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c937;
      sprintf(acStack_2d70,"meta-%d-%d",(ulong)uStack_2df4,uVar9 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c956;
      sprintf(acStack_2b20,"body-%d-%d",(ulong)uStack_2df4,uVar9 & 0xffffffff);
      doc = (btree *)(&bStack_2c70.ksize + uVar9 * 8);
      pcStack_2e08 = (code *)0x11c969;
      sVar4 = strlen(acStack_2c20);
      pcStack_2e08 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_2d70);
      pcStack_2e08 = (code *)0x11c984;
      bodylen = strlen(acStack_2b20);
      pcStack_2e08 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_2c20,sVar4,acStack_2d70,metalen._M_i,acStack_2b20,
                     bodylen);
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_2e08 = (code *)0x11c9ba;
        fdb_set(apfStack_2dc0[(long)pfVar12],*(fdb_doc **)doc);
        pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 1);
      } while ((fdb_kvs_handle *)pcVar10 != pfVar12);
      pcStack_2e08 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_2c70.ksize + uVar9 * 8));
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
    pcStack_2e08 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_2df0,~(byte)uStack_2df4 & 1);
    uStack_2df4 = uStack_2df4 + 1;
    pcVar5 = (char *)(ulong)uStack_2df4;
  } while (uStack_2df4 != 5);
  pcStack_2e08 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_2df0,&pfStack_2dd8,&uStack_2da8);
  pfVar13 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_2e08 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_2dc0,(pfStack_2dd8[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_2de8 = (fdb_kvs_handle *)0x0;
    pcVar5 = acStack_2b20;
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_2e08 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_2dc0[(long)pfVar13],&pfStack_2dc8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_2e08 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_2e08 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_2e08 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_2e08 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_2e08 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_2dc8,&pfStack_2de0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_2e08 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_2e08 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_2de0,(fdb_doc **)&pfStack_2de8);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_2e08 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_2e08 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_2e08 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_2e08 = (code *)0x11cacd;
        sprintf(acStack_2c20,"key%d",metalen._M_i);
        if (pfVar13 == (fdb_kvs_handle *)0x0) {
          pcStack_2e08 = (code *)0x11cb1c;
          sprintf(acStack_2d70,"meta-1-%d",metalen._M_i);
          pcStack_2e08 = (code *)0x11cb30;
          sprintf(pcVar5,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_2e08 = (code *)0x11caf0;
          sprintf(acStack_2d70,"meta-%d-%d",4,metalen._M_i);
          pcStack_2e08 = (code *)0x11cb09;
          sprintf(pcVar5,"body-%d-%d",4);
        }
        pfVar12 = pfStack_2de8;
        doc = (btree *)pfStack_2de8->op_stats;
        pcStack_2e08 = (code *)0x11cb4c;
        iVar3 = bcmp(doc,acStack_2c20,*(size_t *)&pfStack_2de8->kvs_config);
        if (iVar3 != 0) {
          pcStack_2e08 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar12->staletree;
        pcStack_2e08 = (code *)0x11cb6c;
        iVar3 = bcmp(doc,acStack_2d70,(size_t)(pfVar12->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cce6;
        doc = (pfVar12->field_6).seqtree;
        pcStack_2e08 = (code *)0x11cb87;
        iVar3 = bcmp(doc,pcVar5,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011ccd6;
        pcStack_2e08 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar12);
        pfStack_2de8 = (fdb_kvs_handle *)0x0;
        uVar8 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar8;
        pcStack_2e08 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_2de0);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar8 != 10) goto LAB_0011cd00;
      pcStack_2e08 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_2de0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_2e08 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_2dc8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
    } while (pfVar13 != (fdb_kvs_handle *)pcVar10);
    pcVar5 = (char *)0x0;
    do {
      pcStack_2e08 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_2dc0[(long)pcVar5]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar5 = pcVar5 + 1;
    } while (pcVar10 != pcVar5);
    pcStack_2e08 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_2df0,pfStack_2dd8[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_2e08 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_2dd8,uStack_2da8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_2e08 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_2df0);
      pcStack_2e08 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_2e08 = (code *)0x11cc52;
      memleak_end();
      pcVar10 = "single kv mode:";
      if ((char)iStack_2dcc != '\0') {
        pcVar10 = "multiple kv mode:";
      }
      pcStack_2e08 = (code *)0x11cc82;
      sprintf(acStack_2b20,"rollback without seqtree in %s",pcVar10);
      pcVar10 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pcStack_2e08 = (code *)0x11ccaf;
      iVar3 = fprintf(_stderr,pcVar10,acStack_2b20);
      return (void *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  else {
LAB_0011cd14:
    pcStack_2e08 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_2e08 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_2e08 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_2e08 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cd45;
  pcStack_2e30 = pcVar5;
  aStack_2e28.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_2e20 = doc;
  pfStack_2e18 = pfVar12;
  pfStack_2e10 = pfVar13;
  pcStack_2e08 = (code *)pcVar10;
  gettimeofday(&tStack_2f80,(__timezone_ptr_t)0x0);
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar10 = auStack_2f70 + 0x48;
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_2fd8,"./mvcc_test2",(fdb_config *)pcVar10);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar10 = auStack_2f70;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_2f88 = (btreeblk_handle *)auStack_2f70._16_8_;
    pfStack_2f98 = (filemgr *)auStack_2f70._0_8_;
    pdStack_2f90 = (docio_handle *)auStack_2f70._8_8_;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_2fd8,&pfStack_2fd0,(fdb_kvs_config *)&pfStack_2f98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar10 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_2fc7;
    pfVar13 = (fdb_kvs_handle *)0x1555bd;
    uVar9 = 0;
    do {
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar12,"key%d",uVar9);
      handle = pfStack_2fd0;
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cdfd;
      sVar4 = strlen((char *)pfVar12);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(handle,pfVar12,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_2fd8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_2fd8,"./mvcc_test3");
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar10 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_2fc7;
    uVar8 = 0;
    do {
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar12,"key%d",(ulong)uVar8);
      pfVar13 = pfStack_2fd0;
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ce89;
      sVar4 = strlen((char *)pfVar12);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar13,pfVar12,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_2fd8,(fdb_file_info *)auStack_2f70);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar10 = (char *)((ulong)auStack_2f70._40_8_ / (ulong)uStack_2f24);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_2fd8);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf00;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_2f24 * (long)pcVar10,
                       (ulong)((uStack_2f24 >> 2) + uStack_2f24 * 2));
    if (iVar3 < 0) goto LAB_0011d0d2;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf2a;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar10 * 4 + 8) * (ulong)uStack_2f24,
                       (ulong)(uStack_2f24 >> 2));
    if (iVar3 < 0) goto LAB_0011d0d7;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_2fd8,"./mvcc_test3",(fdb_config *)(auStack_2f70 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar10 = (char *)&pfStack_2fb8;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_2f88 = pbStack_2fa8;
    pfStack_2f98 = pfStack_2fb8;
    pdStack_2f90 = pdStack_2fb0;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_2fd8,&pfStack_2fd0,(fdb_kvs_config *)&pfStack_2f98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar8 = 0;
      do {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_2fc7,"key%d",(ulong)uVar8);
        pfVar13 = pfStack_2fd0;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cfc7;
        sVar4 = strlen(acStack_2fc7);
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar13,acStack_2fc7,sVar4);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 10);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_2fd8);
      pfVar13 = (fdb_kvs_handle *)&pfStack_2fb8;
      uVar8 = 0;
      while( true ) {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_2fc7,"key%d",(ulong)uVar8);
        pfVar12 = pfStack_2fd0;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11d021;
        sVar4 = strlen(acStack_2fc7);
        pfStack_2fe0 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar12,acStack_2fc7,sVar4,(void **)pfVar13,&sStack_2fa0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_2fb8);
        uVar8 = uVar8 + 1;
        if (uVar8 == 10) {
          pfStack_2fe0 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_2fd8);
          pfStack_2fe0 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_2fe0 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar10 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar10 = "%s FAILED\n";
          }
          pfStack_2fe0 = (fdb_kvs_handle *)0x11d08e;
          iVar3 = fprintf(_stderr,pcVar10,"crash recover test");
          return (void *)CONCAT44(extraout_var_02,iVar3);
        }
      }
LAB_0011d0af:
      pfVar12 = (fdb_kvs_handle *)acStack_2fc7;
      pcVar10 = "key%d";
      pfStack_2fe0 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_2fe0 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_2ff0 = (fdb_config *)pcVar10;
  pfStack_2fe8 = pfVar12;
  pfStack_2fe0 = pfVar13;
  gettimeofday(&tStack_3110,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_3120 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_3130,"./mvcc_test1",&fStack_30e8);
  fdb_kvs_open_default(pfStack_3130,&pfStack_3118,&fStack_3100);
  fdb_kvs_open(pfStack_3130,&pfStack_3138,"kv",&fStack_3100);
  fVar2 = fdb_set_kv(pfStack_3138,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_3138,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_3130,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_3138,&pfStack_3140,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_3140,&pfStack_3128,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_3140);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_3138);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_3130,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_3128,&pfStack_3120);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_3120);
    fVar2 = fdb_iterator_close(pfStack_3128);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_3140);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_3118);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_3130);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        iVar3 = fprintf(_stderr,pcVar10,"drop kv other handle test");
        return (void *)CONCAT44(extraout_var_03,iVar3);
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return (void *)0x0;
}

Assistant:

void *rollback_during_ops_test(void * args)
{

    TEST_INIT();
    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t rollback_to;
    thread_t tid;
    void *thread_ret;
    bool walflush = true;
    char str[15];
    int i, r;
    int n = 10000;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
        (void)r;

        // Open Database File
        config = fdb_get_default_config();
        // disable block reusing for strict rollback
        config.block_reusing_threshold = 0;
        status = fdb_open(&file, "mvcc_test1", &config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Open KV Store
        kvs_config = fdb_get_default_kvs_config();
        status = fdb_kvs_open_default(file, &kvs, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // set with commits
        for(i=1;i<=n;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            if(i%10==0){
                walflush = !walflush;
                if(walflush){
                    fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                } else {
                    fdb_commit(file, FDB_COMMIT_NORMAL);
                }
            }
        }

        fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);

        // start rollback thread
        thread_create(&tid, rollback_during_ops_test, (void *)&n);

        // updates with commits
        for(i=1;i<=10000;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            if(status == FDB_RESULT_SUCCESS){ // set ok
                status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                if(status != FDB_RESULT_SUCCESS){
                    TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
                }
            } else {
                TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
            }
        }

        // join rollback thread
        thread_join(tid, &thread_ret);

        // set a keys commit and save seqnum
        status = fdb_set_kv(kvs,(void *)"key1", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        rollback_to = kvs_info.last_seqnum;

        // 2 more sets
        status = fdb_set_kv(kvs,(void *)"key2", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(kvs,(void *)"key3", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // rollback to last saved seqnum
        status = fdb_rollback(&kvs, rollback_to);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == rollback_to);

        fdb_close(file);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("rollback during ops test");
        return NULL;
    }

    // open new copy of dbfile and kvs
    config = fdb_get_default_config();
    // disable block reusing for strict rollback
    config.block_reusing_threshold = 0;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reverse set with rollbacks
    n = *((int *)args);
    for(i=n;i>1;i--){
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if(i%10 == 0){
            status = fdb_rollback(&kvs, i);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(file);
    // exit
    thread_exit(0);
    return NULL;

}